

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

void __thiscall
SQCompilation::CheckerVisitor::checkNewSlotNameMatch(CheckerVisitor *this,BinExpr *bin)

{
  if ((this->effectsOnly == false) && ((bin->super_Expr).super_Node._op == TO_NEWSLOT)) {
    checkKeyNameMismatch(this,bin->_lhs,bin->_rhs);
    return;
  }
  return;
}

Assistant:

void CheckerVisitor::checkNewSlotNameMatch(const BinExpr *bin) {
  if (effectsOnly)
    return;

  if (bin->op() != TO_NEWSLOT)
    return;

  const Expr *lhs = bin->lhs();
  const Expr *rhs = bin->rhs();

  checkKeyNameMismatch(lhs, rhs);
}